

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O3

ptr<Statement> __thiscall Parser::ifStatement(Parser *this)

{
  bool bVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_02;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var2;
  Parser *in_RSI;
  ptr<Statement> pVar3;
  ptr<StatementBlock> ifBlock;
  ptr<Expression> condition;
  undefined1 local_59;
  undefined1 local_58 [40];
  undefined1 local_30 [32];
  
  consume(in_RSI);
  expression((Parser *)(local_30 + 0x10));
  statementBlock((Parser *)local_30);
  local_58._16_8_ = (pointer)0x0;
  local_58._24_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  bVar1 = match(in_RSI,Else);
  if (bVar1) {
    consume(in_RSI);
    statementBlock((Parser *)local_58);
    local_58._16_8_ = local_58._0_8_;
    local_58._24_8_ = local_58._8_8_;
  }
  local_58._0_8_ = (pointer)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<IfStatement,std::allocator<IfStatement>,std::shared_ptr<Expression>&,std::shared_ptr<StatementBlock>&,std::shared_ptr<StatementBlock>&>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_58 + 8),(IfStatement **)local_58,
             (allocator<IfStatement> *)&local_59,(shared_ptr<Expression> *)(local_30 + 0x10),
             (shared_ptr<StatementBlock> *)local_30,(shared_ptr<StatementBlock> *)(local_58 + 0x10))
  ;
  (this->filepath)._M_dataplus._M_p = (pointer)local_58._0_8_;
  (this->filepath)._M_string_length = local_58._8_8_;
  _Var2._M_pi = extraout_RDX;
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_58._24_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_58._24_8_);
    _Var2._M_pi = extraout_RDX_00;
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_30._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_30._8_8_);
    _Var2._M_pi = extraout_RDX_01;
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_30._24_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_30._24_8_);
    _Var2._M_pi = extraout_RDX_02;
  }
  pVar3.super___shared_ptr<Statement,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = _Var2._M_pi;
  pVar3.super___shared_ptr<Statement,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (ptr<Statement>)pVar3.super___shared_ptr<Statement,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

ptr<Statement> Parser::ifStatement() {
    consume();
    ptr<Expression> condition = expression();
    ptr<StatementBlock> ifBlock = statementBlock();
    ptr<StatementBlock> elseBlock;

    if(match(TokenType::Else)) {
        consume();
        elseBlock = statementBlock();
    }

    return make<IfStatement>(condition, ifBlock, elseBlock);
}